

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

bool re2::Regexp::SimplifyRegexp(StringPiece *src,ParseFlags flags,string *dst,RegexpStatus *status)

{
  size_type sVar1;
  Regexp *this;
  Regexp *this_00;
  undefined1 local_1a8 [16];
  undefined1 *local_198 [46];
  
  this = Parse(src,flags,status);
  if (this != (Regexp *)0x0) {
    this_00 = Simplify(this);
    Decref(this);
    if (this_00 != (Regexp *)0x0) {
      ToString_abi_cxx11_((string *)local_1a8,this_00);
      std::__cxx11::string::operator=((string *)dst,(string *)local_1a8);
      if ((undefined1 **)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_);
      }
      Decref(this_00);
      return true;
    }
    LogMessage::LogMessage
              ((LogMessage *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/simplify.cc"
               ,0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 8),"Simplify failed on ",0x13);
    re2::operator<<((ostream *)(local_1a8 + 8),src);
    LogMessage::~LogMessage((LogMessage *)local_1a8);
    if (status != (RegexpStatus *)0x0) {
      status->code_ = kRegexpInternalError;
      sVar1 = src->size_;
      (status->error_arg_).data_ = src->data_;
      (status->error_arg_).size_ = sVar1;
    }
  }
  return false;
}

Assistant:

bool Regexp::SimplifyRegexp(const StringPiece& src, ParseFlags flags,
                            std::string* dst, RegexpStatus* status) {
  Regexp* re = Parse(src, flags, status);
  if (re == NULL)
    return false;
  Regexp* sre = re->Simplify();
  re->Decref();
  if (sre == NULL) {
    // Should not happen, since Simplify never fails.
    LOG(ERROR) << "Simplify failed on " << src;
    if (status) {
      status->set_code(kRegexpInternalError);
      status->set_error_arg(src);
    }
    return false;
  }
  *dst = sre->ToString();
  sre->Decref();
  return true;
}